

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int fits_pixel_filter(PixelFilter *filter,int *status)

{
  fitsfile *fptr;
  fitsfile *pfVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint nrec;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int bitpix;
  int ncards;
  int naxis;
  char *DEFAULT_TAGS [1];
  long nelem;
  int more;
  char card [81];
  parseInfo Info;
  long naxes [5];
  ParseData lParse;
  char msg [256];
  
  memset(&Info,0,0x90);
  DEFAULT_TAGS[0] = "X";
  pcVar4 = getenv("DEBUG_PIXFILTER");
  DEBUG_PIXFILTER = (int)(pcVar4 != (char *)0x0);
  memset(&Info,0,0x90);
  if (*status != 0) {
    return *status;
  }
  if ((((filter->tag == (char **)0x0) || (pcVar6 = *filter->tag, pcVar6 == (char *)0x0)) ||
      (*pcVar6 == '\0')) && (filter->tag = DEFAULT_TAGS, pcVar4 != (char *)0x0)) {
    printf("using default tag \'%s\'\n");
  }
  fptr = filter->ofptr;
  pfVar1 = *filter->ifptr;
  lParse.pixFilter = filter;
  iVar2 = ffiprs(pfVar1,0,filter->expression,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  if (iVar2 != 0) goto LAB_0011ef4b;
  if (nelem < 0) {
    nelem = -nelem;
  }
  if (Info.datatype < 0x10) {
    if (Info.datatype == 1) goto LAB_0011ee29;
    if (Info.datatype == 0xe) {
      pcVar4 = "LOGICAL";
    }
    else {
LAB_0011ee50:
      *status = -1;
      ffpmsg("pixel_filter: unexpected result datatype");
      pcVar4 = "UNKNOWN?!";
    }
  }
  else if (Info.datatype == 0x10) {
    *status = -1;
    ffpmsg("pixel_filter: cannot have string image");
LAB_0011ee29:
    pcVar4 = "BIT";
    if (DEBUG_PIXFILTER != 0) {
      puts("hmm, image from bits?");
    }
  }
  else if (Info.datatype == 0x52) {
    pcVar4 = "DOUBLE";
  }
  else {
    if (Info.datatype != 0x29) goto LAB_0011ee50;
    pcVar4 = "LONG";
  }
  if (DEBUG_PIXFILTER != 0) {
    printf("result type is %s [%d]\n",pcVar4,(ulong)(uint)Info.datatype);
  }
  if (*status != 0) goto LAB_0011ef4b;
  iVar2 = ffgipr(pfVar1,5,&bitpix,&naxis,naxes,status);
  if (iVar2 == 0) {
    if (DEBUG_PIXFILTER != 0) {
      printf("input bitpix %d\n",(ulong)(uint)bitpix);
    }
    if ((Info.datatype == 0x52) && (bitpix != -0x40)) {
      bitpix = -0x20;
    }
    if (filter->bitpix != 0) {
      bitpix = filter->bitpix;
    }
    if (DEBUG_PIXFILTER != 0) {
      printf("output bitpix %d\n",(ulong)(uint)bitpix);
    }
    iVar2 = ffcrim(fptr,bitpix,naxis,naxes,status);
    if (iVar2 == 0) {
      iVar2 = ffghsp(pfVar1,&ncards,&more,status);
      if (iVar2 == 0) {
        iVar2 = 0;
        if (0 < ncards) {
          nrec = 0;
          do {
            nrec = nrec + 1;
            iVar2 = ffgrec(pfVar1,nrec,card,status);
            if (iVar2 == 0) {
              iVar2 = ffgkcl(card);
              bVar9 = true;
              bVar7 = false;
              if (((iVar2 != 10) && (0xb < nrec || iVar2 != 0x82)) &&
                 ((bVar7 = iVar2 != 0x28, bVar8 = iVar2 != 0x1e,
                  iVar2 = CONCAT31((int3)((uint)iVar2 >> 8),bVar8), bVar7 && bVar8 ||
                  (bVar7 = false, -1 < bitpix)))) {
                iVar2 = ffprec(fptr,card,status);
                bVar7 = false;
                if (iVar2 != 0) {
                  snprintf(msg,0x100,"pixel_filter: unable to write keycard \'%s\' [%d]\n",card,
                           (ulong)(uint)*status);
                  goto LAB_0011efe3;
                }
              }
            }
            else {
              snprintf(msg,0x100,"pixel_filter: unable to read keycard %d",(ulong)nrec);
LAB_0011efe3:
              ffpmsg(msg);
              bVar9 = false;
              iVar2 = extraout_EAX_00;
              bVar7 = true;
            }
            if (!bVar9) goto LAB_0011f087;
          } while ((int)nrec < ncards);
        }
        bVar7 = false;
      }
      else {
        ffpmsg("pixel_filter: unable to determine number of keycards");
        bVar7 = true;
        iVar2 = extraout_EAX;
      }
LAB_0011f087:
      if (bVar7) goto LAB_0011ef4b;
      if (bVar7) {
        return iVar2;
      }
      if (bitpix < 8) {
        if (bitpix == -0x40) {
          Info.datatype = 0x52;
        }
        else {
          if (bitpix != -0x20) {
LAB_0011f16a:
            snprintf(msg,0x100,"pixel_filter: unexpected output bitpix %d\n");
            ffpmsg(msg);
            *status = -1;
            goto LAB_0011ef4b;
          }
          Info.datatype = 0x2a;
        }
      }
      else if (bitpix == 0x20) {
        Info.datatype = 0x29;
      }
      else if (bitpix == 0x10) {
        Info.datatype = 0x15;
      }
      else {
        if (bitpix != 8) goto LAB_0011f16a;
        Info.datatype = 0xb;
      }
      if (bitpix < 1) {
        bVar9 = true;
      }
      else {
        card._0_8_ = filter->blank;
        bVar9 = true;
        if (card._0_8_ == 0) {
          ncards = 0;
          iVar2 = ffgkyj(pfVar1,"BLANK",(long *)card,(char *)0x0,&ncards);
          bVar9 = iVar2 == 0;
          if (!bVar9) {
            if (bitpix == 0x20) {
              card[0] = '\0';
              card[1] = '\0';
              card[2] = '\0';
              card[3] = -0x80;
              card[4] = -1;
              card[5] = -1;
              card[6] = -1;
              card[7] = -1;
            }
            else if (bitpix == 0x10) {
              card[0] = '\0';
              card[1] = -0x80;
              card[2] = -1;
              card[3] = -1;
              card[4] = -1;
              card[5] = -1;
              card[6] = -1;
              card[7] = -1;
            }
            else if (bitpix == 8) {
              card[0] = -1;
              card[1] = '\0';
              card[2] = '\0';
              card[3] = '\0';
              card[4] = '\0';
              card[5] = '\0';
              card[6] = '\0';
              card[7] = '\0';
            }
            else {
              printf("unhandled positive output BITPIX %d\n");
            }
          }
          filter->blank = card._0_8_;
        }
        ffpnul(fptr,filter->blank,status);
        if (DEBUG_PIXFILTER != 0) {
          printf("using blank %ld\n",card._0_8_);
        }
      }
      iVar2 = lParse.nCols;
      if (filter->keyword[0] == '\0') {
        iVar3 = fits_parser_allocateCol(&lParse,lParse.nCols,status);
        if (iVar3 != 0) goto LAB_0011ef4b;
        lParse.nCols = lParse.nCols + 1;
        lVar5 = (long)iVar2;
        pfVar1 = filter->ofptr;
        lParse.colData[lVar5].fptr = pfVar1;
        lParse.colData[lVar5].iotype = 2;
        set_image_col_types(&lParse,pfVar1,"CREATED",bitpix,lParse.varData + lVar5,
                            lParse.colData + lVar5);
        Info.maxRows = -1;
        Info.parseData = &lParse;
        iVar2 = ffiter(lParse.nCols,lParse.colData,0,0,fits_parser_workfn,&Info,status);
        if (iVar2 == -1) {
          *status = 0;
        }
        else if (*status != 0) goto LAB_0011ef4b;
        if (Info.anyNull != 0) {
          if (!bVar9) {
            ffukyj(fptr,"BLANK",filter->blank,"NULL pixel value",status);
            if (*status != 0) {
              ffpmsg("pixel_filter: unable to write BLANK keyword");
            }
            if (DEBUG_PIXFILTER != 0) {
              puts("output has NULLs");
              printf("wrote blank [%d]\n",(ulong)(uint)*status);
            }
          }
          goto LAB_0011ef4b;
        }
        if ((bitpix < 1) || (iVar2 = ffpnul(fptr,-0x4995cdd1,status), iVar2 == 0))
        goto LAB_0011ef4b;
        pcVar4 = "pixel_filter: unable to reset imgnull";
      }
      else {
        pcVar4 = filter->keyword;
        pcVar6 = filter->comment;
        if (Info.datatype < 0x10) {
          if (Info.datatype == 1) goto LAB_0011f351;
          if (Info.datatype == 0xe) {
            ffukyl(fptr,pcVar4,(int)lParse.Nodes[lParse.resultNode].value.data.log,pcVar6,status);
            goto LAB_0011ef4b;
          }
        }
        else {
          if (Info.datatype == 0x10) {
LAB_0011f351:
            ffukys(fptr,pcVar4,&lParse.Nodes[lParse.resultNode].value.data.log,pcVar6,status);
            goto LAB_0011ef4b;
          }
          if (Info.datatype == 0x29) {
            ffukyj(fptr,pcVar4,lParse.Nodes[lParse.resultNode].value.data.lng,pcVar6,status);
            goto LAB_0011ef4b;
          }
          if (Info.datatype == 0x52) {
            ffukyd(fptr,pcVar4,lParse.Nodes[lParse.resultNode].value.data.dbl,0xf,pcVar6,status);
            goto LAB_0011ef4b;
          }
        }
        pcVar4 = msg;
        snprintf(pcVar4,0x100,"pixel_filter: unexpected constant result type [%d]\n");
      }
    }
    else {
      pcVar4 = "pixel_filter: unable to create output image";
    }
  }
  else {
    pcVar4 = "pixel_filter: unable to read input image parameters";
  }
  ffpmsg(pcVar4);
LAB_0011ef4b:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int fits_pixel_filter (PixelFilter * filter, int * status)
/* Evaluate an expression using the data in the input FITS file(s)          */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info = { 0 };
   int naxis, bitpix;
   long nelem, naxes[MAXDIMS];
   int col_cnt;
   Node *result;
   int datatype;
   fitsfile * infptr;
   fitsfile * outfptr;
   char * DEFAULT_TAGS[] = { "X" };
   char msg[256];
   int writeBlankKwd = 0;   /* write BLANK if any output nulls? */
   ParseData lParse;

   DEBUG_PIXFILTER = getenv("DEBUG_PIXFILTER") ? 1 : 0;

   memset(&Info, 0, sizeof(Info));   

   if (*status)
      return (*status);

   if (!filter->tag || !filter->tag[0] || !filter->tag[0][0]) {
      filter->tag = DEFAULT_TAGS;
      if (DEBUG_PIXFILTER)
         printf("using default tag '%s'\n", filter->tag[0]);
   }

   infptr = filter->ifptr[0];
   outfptr = filter->ofptr;
   lParse.pixFilter = filter;

   if (ffiprs(infptr, 0, filter->expression, MAXDIMS,
	      &Info.datatype, &nelem, &naxis, naxes, &lParse, status)) {
      goto CLEANUP;
   }


   if (nelem < 0) {
      nelem = -nelem;
   }

   {
      /* validate result type */
      const char * type = 0;
      switch (Info.datatype) {
         case TLOGICAL:  type = "LOGICAL"; break;
         case TLONG:     type = "LONG"; break;
         case TDOUBLE:   type = "DOUBLE"; break;
         case TSTRING:   type = "STRING";
                         *status = pERROR;
                         ffpmsg("pixel_filter: cannot have string image");
         case TBIT:      type = "BIT";
                         if (DEBUG_PIXFILTER)
                            printf("hmm, image from bits?\n");
                         break;
         default:       type = "UNKNOWN?!";
                        *status = pERROR;
                        ffpmsg("pixel_filter: unexpected result datatype");
      }
      if (DEBUG_PIXFILTER)
         printf("result type is %s [%d]\n", type, Info.datatype);
      if (*status)
         goto CLEANUP;
   }

   if (fits_get_img_param(infptr, MAXDIMS,
            &bitpix, &naxis, &naxes[0], status)) {
      ffpmsg("pixel_filter: unable to read input image parameters");
      goto CLEANUP;
   }

   if (DEBUG_PIXFILTER)
      printf("input bitpix %d\n", bitpix);

   if (Info.datatype == TDOUBLE) {
       /*  for floating point expressions, set the default output image to
           bitpix = -32 (float) unless the default is already a double */
       if (bitpix != DOUBLE_IMG)
           bitpix = FLOAT_IMG;
   }

   /* override output image bitpix if specified by caller */
   if (filter->bitpix)
      bitpix = filter->bitpix;
   if (DEBUG_PIXFILTER)
      printf("output bitpix %d\n", bitpix);

   if (fits_create_img(outfptr, bitpix, naxis, naxes, status)) {
      ffpmsg("pixel_filter: unable to create output image");
      goto CLEANUP;
   }

   /* transfer keycards */
   {
      int i, ncards, more;
      if (fits_get_hdrspace(infptr, &ncards, &more, status)) {
         ffpmsg("pixel_filter: unable to determine number of keycards");
         goto CLEANUP;
      }

      for (i = 1; i <= ncards; ++i) {

         int keyclass;
         char card[FLEN_CARD];

         if (fits_read_record(infptr, i, card, status)) {
            snprintf(msg, 256,"pixel_filter: unable to read keycard %d", i);
            ffpmsg(msg);
            goto CLEANUP;
         }

         keyclass = fits_get_keyclass(card);
         if (keyclass == TYP_STRUC_KEY) {
            /* output structure defined by fits_create_img */
         }
         else if (keyclass == TYP_COMM_KEY && i < 12) {
            /* assume this is one of the FITS standard comments */
         }
         else if (keyclass == TYP_NULL_KEY && bitpix < 0) {
            /* do not transfer BLANK to real output image */
         }
         else if (keyclass == TYP_SCAL_KEY && bitpix < 0) {
            /* do not transfer BZERO, BSCALE to real output image */
         }
         else if (fits_write_record(outfptr, card, status)) {
            snprintf(msg,256, "pixel_filter: unable to write keycard '%s' [%d]\n",
                        card, *status);
            ffpmsg(msg);
            goto CLEANUP;
         }
      }
   }

   switch (bitpix) {
      case BYTE_IMG: datatype = TLONG; Info.datatype = TBYTE; break;
      case SHORT_IMG: datatype = TLONG; Info.datatype = TSHORT; break;
      case LONG_IMG: datatype = TLONG; Info.datatype = TLONG; break;
      case FLOAT_IMG: datatype = TDOUBLE; Info.datatype = TFLOAT; break;
      case DOUBLE_IMG: datatype = TDOUBLE; Info.datatype = TDOUBLE; break;

      default:
           snprintf(msg, 256,"pixel_filter: unexpected output bitpix %d\n", bitpix);
           ffpmsg(msg);
           *status = pERROR;
           goto CLEANUP;
   }

   if (bitpix > 0) { /* arrange for NULLs in output */
      long nullVal = filter->blank;
      if (!filter->blank) {
         int tstatus = 0;
         if (fits_read_key_lng(infptr, "BLANK", &nullVal, 0, &tstatus)) {

            writeBlankKwd = 1;

            if (bitpix == BYTE_IMG)
                nullVal = UCHAR_MAX;
            else if (bitpix == SHORT_IMG)
                nullVal = SHRT_MIN;
            else if (bitpix == LONG_IMG) {
               if (sizeof(long) == 8 && sizeof(int) == 4)
                  nullVal = INT_MIN;
               else
                  nullVal = LONG_MIN;
            }
            else
                printf("unhandled positive output BITPIX %d\n", bitpix);
         }

         filter->blank = nullVal;
      }

      fits_set_imgnull(outfptr, filter->blank, status);
      if (DEBUG_PIXFILTER)
         printf("using blank %ld\n", nullVal);

   }

   if (!filter->keyword[0]) {
      iteratorCol * colIter;
      DataInfo * varInfo;

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/
      col_cnt = lParse.nCols;
      if (fits_parser_allocateCol(&lParse, col_cnt, status))
         goto CLEANUP;
      lParse.nCols++;

      colIter = &lParse.colData[col_cnt];
      colIter->fptr = filter->ofptr;
      colIter->iotype = OutputCol;
      varInfo = &lParse.varData[col_cnt];
      set_image_col_types(&lParse, colIter->fptr, "CREATED", bitpix, varInfo, colIter);

      Info.maxRows = -1;
      Info.parseData = &lParse;

      if (ffiter(lParse.nCols, lParse.colData, 0,
                     0, fits_parser_workfn, &Info, status) == -1)
            *status = 0;
      else if (*status)
         goto CLEANUP;

      if (Info.anyNull) {
         if (writeBlankKwd) {
            fits_update_key_lng(outfptr, "BLANK", filter->blank, "NULL pixel value", status);
            if (*status)
                ffpmsg("pixel_filter: unable to write BLANK keyword");
            if (DEBUG_PIXFILTER) {
                printf("output has NULLs\n");
                printf("wrote blank [%d]\n", *status);
            }
         }
      }
      else if (bitpix > 0) /* never used a null */
         if (fits_set_imgnull(outfptr, -1234554321, status))
            ffpmsg("pixel_filter: unable to reset imgnull");
   }
   else {

      /* Put constant result into keyword */
      char * parName = filter->keyword;
      char * parInfo = filter->comment;

      result  = lParse.Nodes + lParse.resultNode;
      switch (Info.datatype) {
      case TDOUBLE:
         ffukyd(outfptr, parName, result->value.data.dbl, 15, parInfo, status);
         break;
      case TLONG:
         ffukyj(outfptr, parName, result->value.data.lng, parInfo, status);
         break;
      case TLOGICAL:
         ffukyl(outfptr, parName, result->value.data.log, parInfo, status);
         break;
      case TBIT:
      case TSTRING:
         ffukys(outfptr, parName, result->value.data.str, parInfo, status);
         break;
      default:
         snprintf(msg, 256,"pixel_filter: unexpected constant result type [%d]\n",
                Info.datatype);
         ffpmsg(msg);
      }
   }

CLEANUP:
   ffcprs(&lParse);
   return (*status);
}